

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O0

bool __thiscall
ON_BinaryArchive::Write3dmReferencedComponentIndex
          (ON_BinaryArchive *this,Type component_type,ON_UUID model_id)

{
  bool bVar1;
  Type TVar2;
  int iVar3;
  ON_ManifestMap *this_00;
  ON_ManifestMapItem *this_01;
  ON_ManifestMapItem *map_item;
  int archive_index;
  Type component_type_local;
  ON_BinaryArchive *this_local;
  ON_UUID model_id_local;
  
  model_id_local._0_8_ = model_id.Data4;
  this_local = model_id._0_8_;
  map_item._0_4_ = -0x7fffffff;
  bVar1 = ::operator==(&ON_nil_uuid,(ON_UUID_struct *)&this_local);
  if (bVar1) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,0xc79,"","model_id is nil.");
  }
  else {
    this_00 = ManifestMap(this);
    this_01 = ON_ManifestMap::MapItemFromSourceId(this_00,(ON_UUID *)&this_local);
    TVar2 = ON_ManifestMapItem::ComponentType(this_01);
    if ((component_type == TVar2) && (bVar1 = ON_ManifestMapItem::SourceIsSet(this_01), bVar1)) {
      bVar1 = ReferencedComponentIndexMapping(this);
      if (bVar1) {
        iVar3 = ON_ManifestMapItem::DestinationIndex(this_01);
        if (iVar3 == -0x7fffffff) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                     ,0xc92,"","Unable to get archive component reference index.");
        }
        else {
          map_item._0_4_ = ON_ManifestMapItem::DestinationIndex(this_01);
        }
      }
      else {
        map_item._0_4_ = ON_ManifestMapItem::SourceIndex(this_01);
      }
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                 ,0xc82,"","model_id not in archive manifest map.");
    }
  }
  bVar1 = WriteInt(this,(int)map_item);
  return bVar1;
}

Assistant:

bool ON_BinaryArchive::Write3dmReferencedComponentIndex(
  ON_ModelComponent::Type component_type,
  ON_UUID model_id
  )
{
  // When writing 3dm archives, the model index needs to be converted
  // to an archive index.  This function is used when the model component
  // id is known.
  int archive_index = ON_UNSET_INT_INDEX;
  if (ON_nil_uuid == model_id)
  {
    ON_ERROR("model_id is nil.");
  }
  else
  {
    const ON_ManifestMapItem& map_item = ManifestMap().MapItemFromSourceId(model_id);
    if (component_type != map_item.ComponentType() 
      || false == map_item.SourceIsSet()
      )
    {
      ON_ERROR("model_id not in archive manifest map.");
    }
    else if (false == ReferencedComponentIndexMapping())
    {
      // component reference mapping is disabled (rare)
      archive_index = map_item.SourceIndex();
    }
    else
    {
      // adjust component reference to use the index in the archive (common)
      if (ON_UNSET_INT_INDEX != map_item.DestinationIndex())
      {
        archive_index = map_item.DestinationIndex();
      }
      else
      {
        ON_ERROR("Unable to get archive component reference index.");
      }
    }
  }
  return WriteInt(archive_index);
}